

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O3

Object * __thiscall
Engine::executeGlobalFunction(Engine *this,uint functionName,Object **args,uint argc)

{
  int iVar1;
  CallArgs *this_00;
  undefined4 extraout_var;
  runtime_error *this_01;
  ulong uVar2;
  
  if (this->globalFunctionsCount <= functionName) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Engine::executeGlobalFunction => out of range!");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (CallArgs *)operator_new(0x38);
  CallArgs::CallArgs(this_00,GLOBAL);
  addToCallStack(this,this_00);
  iVar1 = (**this->globalFunctions[functionName]->_vptr_IGlobalFunction)
                    (this->globalFunctions[functionName],args,(ulong)argc);
  removeFromCallStack(this);
  if (argc == 0) {
    if (args == (Object **)0x0) {
      return (Object *)CONCAT44(extraout_var,iVar1);
    }
  }
  else {
    uVar2 = 0;
    do {
      operator_delete(args[uVar2]);
      uVar2 = uVar2 + 1;
    } while (argc != uVar2);
  }
  operator_delete__(args);
  return (Object *)CONCAT44(extraout_var,iVar1);
}

Assistant:

Object* Engine::executeGlobalFunction(unsigned int functionName, Object** args, unsigned int argc) {
	if (functionName < 0 || functionName >= this->globalFunctionsCount) {
		throw std::runtime_error("Engine::executeGlobalFunction => out of range!");
	}
	CallArgs* callArgs = new CallArgs(GLOBAL);
	addToCallStack(callArgs);
	Object* result = this->globalFunctions[functionName]->execute(args, argc);
	removeFromCallStack();
	
	unsigned int i;
	for (i = 0; i < argc; i++) {
		delete args[i];
	}
	delete[] args;
	
	return result;
}